

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O2

void cf_gf128_double(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint32_t in_EDX;
  uint8_t table [2];
  uint8_t local_12 [2];
  
  uVar1 = in[3];
  uVar3 = uVar1 * 2;
  out[3] = uVar3;
  uVar2 = in[2];
  out[2] = uVar1 >> 0x1f | uVar2 << 1;
  uVar1 = in[1];
  out[1] = uVar2 >> 0x1f | uVar1 << 1;
  uVar2 = *in;
  *out = uVar1 >> 0x1f | uVar2 << 1;
  bVar4 = select_u8(uVar2 >> 0x1f,local_12,in_EDX);
  out[3] = bVar4 ^ uVar3;
  return;
}

Assistant:

void cf_gf128_double(const cf_gf128 in, cf_gf128 out)
{
  uint8_t table[2] = { 0x00, 0x87 };
  uint32_t borrow = 0;
  uint32_t inword;

  inword = in[3];   out[3] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[2];   out[2] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[1];   out[1] = (inword << 1) | borrow;  borrow = inword >> 31;
  inword = in[0];   out[0] = (inword << 1) | borrow;  borrow = inword >> 31;
  
#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  out[3] ^= select_u8(borrow, table, 2);
#else
  out[3] ^= table[borrow];
#endif
}